

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.hpp
# Opt level: O0

void __thiscall BCL::write<char>(BCL *this,char *src,GlobalPtr<char> dst,size_t size)

{
  char *pcVar1;
  debug_error *pdVar2;
  char *pcVar3;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 local_e9;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  int local_a4;
  undefined1 local_a0 [4];
  int error_code;
  MPI_Request request;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  size_t local_28;
  size_t size_local;
  char *src_local;
  GlobalPtr<char> dst_local;
  
  local_28 = dst.ptr;
  dst_local.rank = dst.rank;
  size_local = (size_t)this;
  src_local = src;
  pcVar1 = (char *)backend::nprocs();
  pcVar3 = src_local;
  if (pcVar1 < src) {
    request._3_1_ = 1;
    pdVar2 = (debug_error *)__cxa_allocate_exception(0x40);
    std::__cxx11::to_string(&local_88,(unsigned_long)src_local);
    std::operator+(&local_68,"BCL write(): request to write to rank ",&local_88);
    std::operator+(&local_48,&local_68,", which does not exist");
    debug_error::debug_error(pdVar2,&local_48);
    request._3_1_ = 0;
    __cxa_throw(pdVar2,&debug_error::typeinfo,debug_error::~debug_error);
  }
  pcVar1 = (char *)rank();
  if (pcVar3 == pcVar1) {
    pcVar3 = GlobalPtr<char>::local((GlobalPtr<char> *)&src_local);
    ::memcpy(pcVar3,(void *)size_local,local_28);
  }
  else {
    local_a4 = MPI_Rput(size_local,local_28 & 0xffffffff,&ompi_mpi_char,
                        (ulong)src_local & 0xffffffff,dst_local.rank,local_28 & 0xffffffff,
                        &ompi_mpi_char,win,local_a0);
    if (local_a4 != 0) {
      local_e9 = 1;
      pdVar2 = (debug_error *)__cxa_allocate_exception(0x40);
      std::__cxx11::to_string(&local_e8,local_a4);
      std::operator+(&local_c8,"BCL write(): MPI_Rput return error code.",&local_e8);
      debug_error::debug_error(pdVar2,&local_c8);
      local_e9 = 0;
      __cxa_throw(pdVar2,&debug_error::typeinfo,debug_error::~debug_error);
    }
    local_a4 = MPI_Wait(local_a0,0);
    if (local_a4 != 0) {
      pdVar2 = (debug_error *)__cxa_allocate_exception(0x40);
      std::__cxx11::to_string(&local_130,local_a4);
      std::operator+(&local_110,"BCL write(): MPI_Wait return error code ",&local_130);
      debug_error::debug_error(pdVar2,&local_110);
      __cxa_throw(pdVar2,&debug_error::typeinfo,debug_error::~debug_error);
    }
  }
  return;
}

Assistant:

inline void write(const T *src, GlobalPtr<T> dst, size_t size) {
  BCL_DEBUG(
    if (dst.rank > BCL::backend::nprocs()) {
      throw debug_error("BCL write(): request to write to rank " +
                        std::to_string(dst.rank) + ", which does not exist");
    }
  )
  if (dst.rank == BCL::rank()) {
    std::memcpy(dst.local(), src, size*sizeof(T));
  } else {
    MPI_Request request;

    int error_code = MPI_Rput(src, size*sizeof(T), MPI_CHAR,
                              dst.rank, dst.ptr, size*sizeof(T), MPI_CHAR,
                              BCL::win, &request);
    BCL_DEBUG(
            if (error_code != MPI_SUCCESS) {
              throw debug_error("BCL write(): MPI_Rput return error code." + std::to_string(error_code));
            }
    )

    error_code = MPI_Wait(&request, MPI_STATUS_IGNORE);

    BCL_DEBUG(
            if (error_code != MPI_SUCCESS) {
              throw debug_error("BCL write(): MPI_Wait return error code " + std::to_string(error_code));
            }
    )
  }
}